

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConn.cpp
# Opt level: O0

void __thiscall TcpConn::OnWrite(TcpConn *this)

{
  BufferChain *pBVar1;
  uint16_t uVar2;
  int __fd;
  char *pcVar3;
  int32_t ret;
  BufferChain *cur;
  ssize_t count;
  ssize_t wn;
  BufferChain *pBStack_18;
  int iocount;
  BufferChain *pkt;
  TcpConn *this_local;
  
  if ((this->super_Buffer).m_writeHead == (BufferChain *)0x0) {
    __assert_fail("m_writeHead != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/alphavip[P]pollevent/loop/TcpConn.cpp"
                  ,0x5d,"virtual void TcpConn::OnWrite()");
  }
  pBStack_18 = (this->super_Buffer).m_writeHead;
  for (wn._4_4_ = 0; (pBStack_18 != (BufferChain *)0x0 && (wn._4_4_ < 0x100));
      wn._4_4_ = wn._4_4_ + 1) {
    pcVar3 = BufferChain::GetReadAddr(pBStack_18);
    OnWrite::iov[wn._4_4_].iov_base = pcVar3;
    uVar2 = BufferChain::GetCanReadCount(pBStack_18);
    OnWrite::iov[wn._4_4_].iov_len = (ulong)uVar2;
    pBStack_18 = pBStack_18->nextpkt;
  }
  __fd = (*(this->super_PollObj)._vptr_PollObj[2])();
  cur = (BufferChain *)writev(__fd,(iovec *)OnWrite::iov,wn._4_4_);
  if (-1 < (long)cur) {
    pBStack_18 = (this->super_Buffer).m_writeHead;
    while( true ) {
      if ((pBStack_18 == (BufferChain *)0x0) || (cur == (BufferChain *)0x0)) goto LAB_0010774b;
      uVar2 = BufferChain::GetCanReadCount(pBStack_18);
      if ((long)cur < (long)(ulong)uVar2) break;
      uVar2 = BufferChain::GetCanReadCount(pBStack_18);
      cur = (BufferChain *)((long)cur - (ulong)uVar2);
      (this->super_Buffer).m_writeHead = pBStack_18->nextpkt;
      pBVar1 = pBStack_18->nextpkt;
      (*(this->super_PollObj)._vptr_PollObj[10])(this,pBStack_18);
      pBStack_18 = pBVar1;
    }
    pBStack_18->read = pBStack_18->read + (short)cur;
LAB_0010774b:
    if ((this->super_Buffer).m_writeHead == (BufferChain *)0x0) {
      (this->super_Buffer).m_writeTail = (BufferChain *)0x0;
      Poller::Mod((this->super_PollObj).m_pPoller,&this->super_PollObj,0x11);
    }
  }
  return;
}

Assistant:

void TcpConn::OnWrite()
{
    assert(m_writeHead != nullptr);

    // 写入网络数据
#define maxionum 256
    static struct iovec iov[maxionum];
    BufferChain* pkt = m_writeHead;
    int iocount = 0;
    while(pkt != NULL)
    {
        if(iocount >= maxionum)
        {
            break;
        }
        iov[iocount].iov_base = pkt->GetReadAddr();
        iov[iocount].iov_len = pkt->GetCanReadCount();
        pkt = pkt->nextpkt;
        iocount++;
    }

    //边缘触发 这里也要改 要在这次里写完
    ssize_t wn = writev(GetSockFd(), iov, iocount);
    if(wn < 0)
    {
        return;
    }

    ssize_t count = wn;
    pkt = m_writeHead;
    while(pkt != NULL)
    {
        if(count == 0)
        {
            break;
        }

        if(count < pkt->GetCanReadCount())
        {
            pkt->read += count;
            count = 0;
            break;
        }
        else
        {
            count -= pkt->GetCanReadCount();
            m_writeHead = pkt->nextpkt;
            BufferChain* cur = pkt;
            pkt = pkt->nextpkt;
            Cycle(cur);
        }
    }


    if(m_writeHead == nullptr)
    {
        m_writeTail = nullptr;
        int32_t ret = m_pPoller->Mod(this, EV_READ|EV_ET);
        if(ret != 0)
        {
            return;
        }
    }
}